

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ST2052_TextParser.cpp
# Opt level: O2

h__TextParser * __thiscall
AS_02::TimedText::ST2052_TextParser::h__TextParser::OpenRead(h__TextParser *this)

{
  _Rb_tree_node_base *__lhs;
  _Rb_tree_header *p_Var1;
  char cVar2;
  __type _Var3;
  _Base_ptr p_Var4;
  ILogSink *pIVar5;
  char *__s;
  iterator iVar6;
  string *in_RSI;
  allocator<char> local_1d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  AttributeVisitor png_visitor;
  AttributeVisitor font_visitor;
  pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t> local_128;
  h__TextParser *local_f8;
  _func_int **local_f0;
  string *local_e8;
  string *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  char buf [64];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  UUID font_id;
  
  pthread_mutex_lock((pthread_mutex_t *)&sg_default_font_family_list_lock);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&png_visitor,"default",(allocator<char> *)&font_visitor);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&sg_default_font_family_list_abi_cxx11_,&png_visitor.attr_name);
  std::__cxx11::string::~string((string *)&png_visitor);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&png_visitor,"monospace",(allocator<char> *)&font_visitor);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&sg_default_font_family_list_abi_cxx11_,&png_visitor.attr_name);
  std::__cxx11::string::~string((string *)&png_visitor);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&png_visitor,"sansSerif",(allocator<char> *)&font_visitor);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&sg_default_font_family_list_abi_cxx11_,&png_visitor.attr_name);
  std::__cxx11::string::~string((string *)&png_visitor);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&png_visitor,"serif",(allocator<char> *)&font_visitor);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&sg_default_font_family_list_abi_cxx11_,&png_visitor.attr_name);
  std::__cxx11::string::~string((string *)&png_visitor);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&png_visitor,"monospaceSansSerif",(allocator<char> *)&font_visitor);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&sg_default_font_family_list_abi_cxx11_,&png_visitor.attr_name);
  std::__cxx11::string::~string((string *)&png_visitor);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&png_visitor,"monospaceSerif",(allocator<char> *)&font_visitor);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&sg_default_font_family_list_abi_cxx11_,&png_visitor.attr_name);
  std::__cxx11::string::~string((string *)&png_visitor);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&png_visitor,"proportionalSansSerif",(allocator<char> *)&font_visitor);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&sg_default_font_family_list_abi_cxx11_,&png_visitor.attr_name);
  std::__cxx11::string::~string((string *)&png_visitor);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&png_visitor,"proportionalSerif",(allocator<char> *)&font_visitor);
  std::
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  ::_M_insert_unique<std::__cxx11::string>
            ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&sg_default_font_family_list_abi_cxx11_,&png_visitor.attr_name);
  std::__cxx11::string::~string((string *)&png_visitor);
  pthread_mutex_unlock((pthread_mutex_t *)&sg_default_font_family_list_lock);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&png_visitor,*(char **)(in_RSI + 0xd0),(allocator<char> *)&font_visitor);
  cVar2 = Kumu::XMLElement::ParseString(in_RSI);
  std::__cxx11::string::~string((string *)&png_visitor);
  if (cVar2 == '\0') {
    pIVar5 = (ILogSink *)Kumu::DefaultLogSink();
    Kumu::ILogSink::Error(pIVar5,"ST 2052-1 document is not well-formed.\n");
    Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
  }
  else {
    std::__cxx11::string::assign((char *)(in_RSI + 0x130));
    local_e0 = in_RSI + 0x150;
    std::__cxx11::
    list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
    ::clear((list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
             *)local_e0);
    *(undefined4 *)(in_RSI + 0xf8) = 0;
    local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (in_RSI + 0x110);
    if (*(long *)(in_RSI + 0x118) == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&font_visitor,"conformsToStandard",(allocator<char> *)buf);
      Kumu::ElementVisitor::ElementVisitor((ElementVisitor *)&png_visitor,&font_visitor.attr_name);
      std::__cxx11::string::~string((string *)&font_visitor);
      Kumu::apply_visitor<Kumu::ElementVisitor>((XMLElement *)in_RSI,(ElementVisitor *)&png_visitor)
      ;
      p_Var1 = &png_visitor.value_list._M_t._M_impl.super__Rb_tree_header;
      for (p_Var4 = png_visitor.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4))
      {
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(p_Var4 + 1),&IMSC1_imageProfile_abi_cxx11_);
        if (_Var3) {
LAB_0014635e:
          std::__cxx11::string::_M_assign((string *)local_1d8);
          break;
        }
        _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )(p_Var4 + 1),&IMSC1_textProfile_abi_cxx11_);
        if (_Var3) goto LAB_0014635e;
      }
      Kumu::ElementVisitor::~ElementVisitor((ElementVisitor *)&png_visitor);
      if (*(long *)(in_RSI + 0x118) == 0) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&font_visitor,"profile",(allocator<char> *)buf);
        Kumu::AttributeVisitor::AttributeVisitor(&png_visitor,&font_visitor.attr_name);
        std::__cxx11::string::~string((string *)&font_visitor);
        Kumu::apply_visitor<Kumu::AttributeVisitor>((XMLElement *)in_RSI,&png_visitor);
        for (p_Var4 = png_visitor.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)
            ) {
          _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(p_Var4 + 1),&IMSC1_imageProfile_abi_cxx11_);
          if (_Var3) {
LAB_0014640e:
            std::__cxx11::string::_M_assign((string *)local_1d8);
            break;
          }
          _Var3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(p_Var4 + 1),&IMSC1_textProfile_abi_cxx11_);
          if (_Var3) goto LAB_0014640e;
        }
        Kumu::AttributeVisitor::~AttributeVisitor(&png_visitor);
      }
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&font_visitor,"backgroundImage",(allocator<char> *)buf);
    Kumu::AttributeVisitor::AttributeVisitor(&png_visitor,&font_visitor.attr_name);
    local_f8 = this;
    std::__cxx11::string::~string((string *)&font_visitor);
    Kumu::apply_visitor<Kumu::AttributeVisitor>((XMLElement *)in_RSI,&png_visitor);
    local_e8 = in_RSI + 0x80;
    local_f0 = (_func_int **)&PTR__IArchive_00169290;
    for (p_Var4 = png_visitor.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 != &png_visitor.value_list._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      Kumu::PathBasename((string *)&font_visitor,(char)p_Var4 + ' ');
      CreatePNGNameId((UUID *)buf,&font_visitor.attr_name);
      std::__cxx11::string::~string((string *)&font_visitor);
      local_128.first.super_Identifier<16U>.super_IArchive._vptr_IArchive = (_func_int **)buf._9_8_;
      local_128.first.super_Identifier<16U>.m_HasValue = SUB81(buf._17_8_,0);
      local_128.first.super_Identifier<16U>.m_Value._0_7_ = SUB87(buf._17_8_,1);
      local_128.first.super_Identifier<16U>.m_Value[7] = '\x01';
      local_128.first.super_Identifier<16U>.m_Value[8] = '\0';
      local_128.first.super_Identifier<16U>.m_Value[9] = '\0';
      local_128.first.super_Identifier<16U>.m_Value[10] = '\0';
      std::__cxx11::
      list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
      ::push_back((list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                   *)local_e0,(value_type *)&local_128);
      font_visitor.attr_name.field_2._1_8_ =
           CONCAT71(local_128.first.super_Identifier<16U>.m_Value._0_7_,
                    local_128.first.super_Identifier<16U>.m_HasValue);
      font_visitor.attr_name._9_8_ =
           local_128.first.super_Identifier<16U>.super_IArchive._vptr_IArchive;
      font_visitor.attr_name._M_string_length._0_1_ = 1;
      font_visitor.attr_name._M_dataplus._M_p = (pointer)local_f0;
      font_visitor.value_list._M_t._M_impl._0_4_ = 1;
      std::
      _Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>,std::_Select1st<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>>
      ::_M_insert_unique<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>
                ((_Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>,std::_Select1st<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>>
                  *)local_e8,(pair<const_Kumu::UUID,_ASDCP::TimedText::MIMEType_t> *)&font_visitor);
      if (*(long *)(in_RSI + 0x118) == 0) {
        std::__cxx11::string::_M_assign((string *)local_1d8);
      }
    }
    if (*(long *)(in_RSI + 0xa8) != 0) {
      _Var3 = std::operator==(local_1d8,&IMSC1_textProfile_abi_cxx11_);
      if (_Var3) {
        pIVar5 = (ILogSink *)Kumu::DefaultLogSink();
        Kumu::ILogSink::Warn(pIVar5,"Unexpected IMSC-1 text profile; document contains images.\n ");
      }
    }
    if (*(long *)(in_RSI + 0x118) == 0) {
      pIVar5 = (ILogSink *)Kumu::DefaultLogSink();
      Kumu::ILogSink::Warn(pIVar5,"Using default IMSC-1 text profile.\n ");
      std::__cxx11::string::_M_assign((string *)local_1d8);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)buf,"fontFamily",(allocator<char> *)&local_128);
    Kumu::AttributeVisitor::AttributeVisitor(&font_visitor,(string *)buf);
    std::__cxx11::string::~string((string *)buf);
    Kumu::apply_visitor<Kumu::AttributeVisitor>((XMLElement *)in_RSI,&font_visitor);
    for (p_Var4 = font_visitor.value_list._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        this = local_f8,
        (_Rb_tree_header *)p_Var4 != &font_visitor.value_list._M_t._M_impl.super__Rb_tree_header;
        p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      __lhs = p_Var4 + 1;
      Kumu::PathBasename((string *)&local_128,(char)__lhs);
      CreateFontNameId(&font_id,(string *)&local_128);
      std::__cxx11::string::~string((string *)&local_128);
      __s = Kumu::UUID::EncodeHex(&font_id,buf,0x40);
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,__s,&local_1d9);
      cVar2 = Kumu::PathIsFile((string *)&local_128);
      if (cVar2 == '\0') {
        std::operator+(&local_d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       ".ttf");
        cVar2 = Kumu::PathIsFile((string *)&local_d8);
        if (cVar2 != '\0') {
          std::__cxx11::string::~string((string *)&local_d8);
          std::__cxx11::string::~string((string *)&local_128);
          goto LAB_00146764;
        }
        std::operator+(&local_70,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__lhs,
                       ".otf");
        cVar2 = Kumu::PathIsFile((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_70);
        std::__cxx11::string::~string((string *)&local_d8);
        std::__cxx11::string::~string((string *)&local_128);
        if (cVar2 != '\0') goto LAB_00146764;
        pthread_mutex_lock((pthread_mutex_t *)&sg_default_font_family_list_lock);
        iVar6 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&sg_default_font_family_list_abi_cxx11_._M_t,(key_type *)__lhs);
        if ((_Rb_tree_header *)iVar6._M_node ==
            &sg_default_font_family_list_abi_cxx11_._M_t._M_impl.super__Rb_tree_header) {
          pIVar5 = (ILogSink *)Kumu::DefaultLogSink();
          this = local_f8;
          Kumu::ILogSink::Error
                    (pIVar5,"Unable to locate external font resource \"%s\".\n",*(undefined8 *)__lhs
                    );
          Kumu::Result_t::Result_t((Result_t *)this,(Result_t *)ASDCP::RESULT_FORMAT);
          pthread_mutex_unlock((pthread_mutex_t *)&sg_default_font_family_list_lock);
          goto LAB_00146839;
        }
        pthread_mutex_unlock((pthread_mutex_t *)&sg_default_font_family_list_lock);
      }
      else {
        std::__cxx11::string::~string((string *)&local_128);
LAB_00146764:
        local_d8._M_dataplus._M_p = (pointer)font_id.super_Identifier<16U>.m_Value._0_8_;
        local_d8._M_string_length._0_1_ = font_id.super_Identifier<16U>.m_Value[8];
        local_d8._M_string_length._1_1_ = font_id.super_Identifier<16U>.m_Value[9];
        local_d8._M_string_length._2_1_ = font_id.super_Identifier<16U>.m_Value[10];
        local_d8._M_string_length._3_1_ = font_id.super_Identifier<16U>.m_Value[0xb];
        local_d8._M_string_length._4_1_ = font_id.super_Identifier<16U>.m_Value[0xc];
        local_d8._M_string_length._5_1_ = font_id.super_Identifier<16U>.m_Value[0xd];
        local_d8._M_string_length._6_1_ = font_id.super_Identifier<16U>.m_Value[0xe];
        local_d8._M_string_length._7_1_ = font_id.super_Identifier<16U>.m_Value[0xf];
        local_d8.field_2._M_allocated_capacity._0_4_ = 2;
        std::__cxx11::
        list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
        ::push_back((list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                     *)local_e0,(value_type *)&local_d8);
        local_128.first.super_Identifier<16U>.m_Value._0_7_ = SUB87(local_d8._M_dataplus._M_p,0);
        local_128.first.super_Identifier<16U>.m_Value[7] =
             (byte_t)((ulong)local_d8._M_dataplus._M_p >> 0x38);
        local_128.first.super_Identifier<16U>.m_Value._8_3_ = SUB83(local_d8._M_string_length,0);
        local_128.first.super_Identifier<16U>.m_Value._11_5_ =
             SUB85(local_d8._M_string_length >> 0x18,0);
        local_128.first.super_Identifier<16U>.m_HasValue = true;
        local_128.first.super_Identifier<16U>.super_IArchive._vptr_IArchive = local_f0;
        local_128.second = MT_OPENTYPE;
        std::
        _Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>,std::_Select1st<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>>
        ::_M_insert_unique<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>
                  ((_Rb_tree<Kumu::UUID,std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>,std::_Select1st<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>,std::less<Kumu::UUID>,std::allocator<std::pair<Kumu::UUID_const,ASDCP::TimedText::MIMEType_t>>>
                    *)local_e8,&local_128);
      }
    }
    Kumu::Result_t::Result_t((Result_t *)local_f8,(Result_t *)Kumu::RESULT_OK);
LAB_00146839:
    Kumu::AttributeVisitor::~AttributeVisitor(&font_visitor);
    Kumu::AttributeVisitor::~AttributeVisitor(&png_visitor);
  }
  return this;
}

Assistant:

Result_t
AS_02::TimedText::ST2052_TextParser::h__TextParser::OpenRead()
{
  setup_default_font_family_list();

  if ( ! m_Root.ParseString(m_XMLDoc.c_str()) )
    {
      DefaultLogSink(). Error("ST 2052-1 document is not well-formed.\n");
      return RESULT_FORMAT;
    }

  m_TDesc.EncodingName = "UTF-8"; // the XML parser demands UTF-8
  m_TDesc.ResourceList.clear();
  m_TDesc.ContainerDuration = 0;
  std::set<std::string>::const_iterator i;

  // Attempt to set the profile from <conformsToStandard>
  if ( m_TDesc.NamespaceName.empty() )
    {
      ElementVisitor conforms_visitor("conformsToStandard");
      apply_visitor(m_Root, conforms_visitor);

      for ( i = conforms_visitor.value_list.begin(); i != conforms_visitor.value_list.end(); ++i )
	{
	  if ( *i == IMSC1_imageProfile || *i == IMSC1_textProfile )
	    {
	      m_TDesc.NamespaceName = *i;
	      break;
	    }
	}
    }

  // Attempt to set the profile from the use of attribute "profile"
  if ( m_TDesc.NamespaceName.empty() )
    {
      AttributeVisitor profile_visitor("profile");
      apply_visitor(m_Root, profile_visitor);

      for ( i = profile_visitor.value_list.begin(); i != profile_visitor.value_list.end(); ++i )
	{
	  if ( *i == IMSC1_imageProfile || *i == IMSC1_textProfile )
	    {
	      m_TDesc.NamespaceName = *i;
	      break;
	    }
	}
    }

  // Find image resources for later packaging as GS partitions.
  // Attempt to set the profile; infer from use of images.
  AttributeVisitor png_visitor("backgroundImage");
  apply_visitor(m_Root, png_visitor);

  for ( i = png_visitor.value_list.begin(); i != png_visitor.value_list.end(); ++i )
    {
      UUID asset_id = CreatePNGNameId(PathBasename(*i));
      TimedTextResourceDescriptor png_resource;
      memcpy(png_resource.ResourceID, asset_id.Value(), UUIDlen);
      png_resource.Type = ASDCP::TimedText::MT_PNG;
      m_TDesc.ResourceList.push_back(png_resource);
      m_ResourceTypes.insert(ResourceTypeMap_t::value_type(UUID(png_resource.ResourceID),
							   ASDCP::TimedText::MT_PNG));

      if ( m_TDesc.NamespaceName.empty() )
	{
	  m_TDesc.NamespaceName = IMSC1_imageProfile;
	}
    }

  // If images are present and profile is "text" make sure to say something.
  if ( ! m_ResourceTypes.empty() && m_TDesc.NamespaceName == IMSC1_textProfile )
    {
      DefaultLogSink().Warn("Unexpected IMSC-1 text profile; document contains images.\n ");
    }
  
  // If all else fails set the profile to "text".
  if ( m_TDesc.NamespaceName.empty() )
    {
      DefaultLogSink().Warn("Using default IMSC-1 text profile.\n ");
      m_TDesc.NamespaceName = IMSC1_textProfile;
    }

  // Find font resources for later packaging as GS partitions.
  AttributeVisitor font_visitor("fontFamily");
  apply_visitor(m_Root, font_visitor);
  char buf[64];

  for ( i = font_visitor.value_list.begin(); i != font_visitor.value_list.end(); ++i )
    {
      UUID font_id = CreateFontNameId(PathBasename(*i));

      if ( PathIsFile(font_id.EncodeHex(buf, 64))
	   || PathIsFile(*i+".ttf")
	   || PathIsFile(*i+".otf") )
	{
	  TimedTextResourceDescriptor font_resource;
	  memcpy(font_resource.ResourceID, font_id.Value(), UUIDlen);
	  font_resource.Type = ASDCP::TimedText::MT_OPENTYPE;
	  m_TDesc.ResourceList.push_back(font_resource);
	  m_ResourceTypes.insert(ResourceTypeMap_t::value_type(UUID(font_resource.ResourceID),
							       ASDCP::TimedText::MT_OPENTYPE));
	}
      else
	{
	  AutoMutex l(sg_default_font_family_list_lock);
	  if ( sg_default_font_family_list.find(*i) == sg_default_font_family_list.end() )
	    {
	      DefaultLogSink(). Error("Unable to locate external font resource \"%s\".\n", i->c_str());
	      return RESULT_FORMAT;
	    }
	}
    }

  return RESULT_OK;
}